

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  list<int,_std::allocator<int>_> *__last;
  int iVar1;
  ostream *poVar2;
  int iVar3;
  params arguments;
  solution sol;
  
  params::params(&arguments,argc,argv);
  if (arguments.help_required == true) {
    poVar2 = operator<<((ostream *)&std::cout,(help_type *)&params::help);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    __last = &arguments.capacities;
    if (arguments.measure == 0) {
      iVar1 = std::accumulate<std::_List_const_iterator<int>,int>
                        ((_List_const_iterator<int>)
                         arguments.capacities.super__List_base<int,_std::allocator<int>_>._M_impl.
                         _M_node.super__List_node_base._M_next,(_List_const_iterator<int>)__last,0);
      solution::solution<std::_List_const_iterator<int>>
                (&sol,(_List_const_iterator<int>)
                      arguments.capacities.super__List_base<int,_std::allocator<int>_>._M_impl.
                      _M_node.super__List_node_base._M_next,(_List_const_iterator<int>)__last);
      iVar3 = 0;
      if (0 < iVar1) {
        iVar3 = iVar1;
      }
      for (iVar1 = 1; iVar1 - iVar3 != 1; iVar1 = iVar1 + 1) {
        solution::find_solution(&sol,iVar1,arguments.max_steps);
        poVar2 = operator<<((ostream *)&std::cout,&sol);
        std::endl<char,std::char_traits<char>>(poVar2);
      }
    }
    else {
      solution::solution<std::_List_const_iterator<int>>
                (&sol,(_List_const_iterator<int>)
                      arguments.capacities.super__List_base<int,_std::allocator<int>_>._M_impl.
                      _M_node.super__List_node_base._M_next,(_List_const_iterator<int>)__last);
      solution::find_solution(&sol,arguments.measure,arguments.max_steps);
      poVar2 = operator<<((ostream *)&std::cout,&sol);
      std::endl<char,std::char_traits<char>>(poVar2);
    }
    solution::~solution(&sol);
  }
  std::__cxx11::_List_base<int,_std::allocator<int>_>::_M_clear
            (&arguments.capacities.super__List_base<int,_std::allocator<int>_>);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
	int rc = EXIT_SUCCESS;

	try {
		const params arguments{argc, argv};
		if (arguments.help_required)
			std::cout << params::help << std::endl;
		else
			find_solutions(arguments);
	}
	catch (const std::exception& e) {
		std::cerr << "\nError: " << e.what() << std::endl;
		rc = EXIT_FAILURE;
	}

	return rc;
}